

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

bool kj::_::hasSubstring(StringPtr haystack,StringPtr needle)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  ArrayPtr<const_char> local_48;
  ulong local_38;
  size_t i;
  StringPtr needle_local;
  StringPtr haystack_local;
  
  needle_local.content.ptr = (char *)needle.content.size_;
  i = (size_t)needle.content.ptr;
  needle_local.content.size_ = (size_t)haystack.content.ptr;
  sVar3 = StringPtr::size((StringPtr *)&i);
  sVar4 = StringPtr::size((StringPtr *)&needle_local.content.size_);
  if (sVar3 <= sVar4) {
    local_38 = 0;
    while( true ) {
      uVar1 = local_38;
      sVar3 = StringPtr::size((StringPtr *)&needle_local.content.size_);
      sVar4 = StringPtr::size((StringPtr *)&i);
      if (sVar3 - sVar4 < uVar1) break;
      local_48 = (ArrayPtr<const_char>)
                 StringPtr::slice((StringPtr *)&needle_local.content.size_,local_38);
      bVar2 = StringPtr::startsWith((StringPtr *)&local_48,(StringPtr *)&i);
      if (bVar2) {
        return true;
      }
      local_38 = local_38 + 1;
    }
  }
  return false;
}

Assistant:

bool hasSubstring(StringPtr haystack, StringPtr needle) {
  // TODO(perf): This is not the best algorithm for substring matching.
  if (needle.size() <= haystack.size()) {
    for (size_t i = 0; i <= haystack.size() - needle.size(); i++) {
      if (haystack.slice(i).startsWith(needle)) {
        return true;
      }
    }
  }
  return false;
}